

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall TestMaterial::RandomTestSupportFunction(TestMaterial *this)

{
  double *pdVar1;
  long *plVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *__s;
  time_t tVar13;
  void *__s_00;
  clock_t cVar14;
  clock_t cVar15;
  ostream *poVar16;
  long lVar17;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomTestSupportFunction",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  __s = operator_new(24000000);
  memset(__s,0,24000000);
  tVar13 = time((time_t *)0x0);
  srand((uint)tVar13);
  __s_00 = operator_new(24000000);
  memset(__s_00,0,24000000);
  lVar17 = 0x10;
  do {
    iVar9 = rand();
    iVar10 = rand();
    iVar11 = rand();
    iVar12 = rand();
    dVar3 = log((double)iVar9 / 2147483647.0);
    dVar3 = dVar3 * -2.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar4 = cos(((double)iVar10 / 2147483647.0) * 6.283185307179586);
    dVar5 = log((double)iVar10 / 2147483647.0);
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = cos(((double)iVar9 / 2147483647.0) * 6.283185307179586);
    dVar7 = log((double)iVar11 / 2147483647.0);
    dVar7 = dVar7 * -2.0;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar8 = cos(((double)iVar12 / 2147483647.0) * 6.283185307179586);
    pdVar1 = (double *)((long)__s_00 + lVar17 + -0x10);
    *pdVar1 = dVar4 * dVar3;
    pdVar1[1] = dVar6 * dVar5;
    *(double *)((long)__s_00 + lVar17) = dVar8 * dVar7;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x16e3610);
  lVar17 = 0;
  cVar14 = clock();
  do {
    plVar2 = *(long **)(*(long *)&this->field_0x8 + (ulong)this->CurrentObj * 8);
    (**(code **)(*plVar2 + 0x20))(&local_48,plVar2,(long)__s_00 + lVar17);
    *(undefined8 *)((long)__s + lVar17 + 0x10) = local_38;
    *(undefined8 *)((long)__s + lVar17) = local_48;
    ((undefined8 *)((long)__s + lVar17))[1] = uStack_40;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 24000000);
  cVar15 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  poVar16 = std::ostream::_M_insert<double>((double)(cVar15 - cVar14) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  operator_delete(__s_00,24000000);
  operator_delete(__s,24000000);
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunction()
{
  std::cout << "RandomTestSupportFunction" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd);

  clock_t begin, end;
  srand(static_cast<unsigned int>(time(NULL)));



  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {

    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();

  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    supportVector[j] = sObj[CurrentObj]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

  // print the data in a file
#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupport_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for (long j=0; j<RandomTestEnd; j++)
    outfile<< supportVector[j] <<std::endl;
  outfile.close();
#endif // OUTPUT_FILE
}